

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::anon_unknown_2::LineWidthCase::test(LineWidthCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  GLfloat range [2];
  Random rnd;
  float local_38 [2];
  deRandom local_30;
  
  deRandom_init(&local_30,0xabcdef);
  local_38[0] = 1.0;
  local_38[1] = 0.0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetFloatv(this_00,0x846e,local_38);
  ApiCase::expectError(&this->super_ApiCase,0);
  (*this->m_verifier->_vptr_StateVerifier[2])
            (0x3f800000,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb21);
  ApiCase::expectError(&this->super_ApiCase,0);
  iVar1 = 0x78;
  do {
    fVar3 = local_38[0];
    fVar4 = local_38[1] - local_38[0];
    fVar2 = deRandom_getFloat(&local_30);
    fVar3 = fVar2 * fVar4 + fVar3;
    glu::CallLogWrapper::glLineWidth(this_00,fVar3);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (fVar3,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb21);
    ApiCase::expectError(&this->super_ApiCase,0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		GLfloat range[2] = {1};
		glGetFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);
		expectError(GL_NO_ERROR);

		m_verifier->verifyFloat(m_testCtx, GL_LINE_WIDTH, 1.0f);
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLfloat reference = rnd.getFloat(range[0], range[1]);

			glLineWidth(reference);
			m_verifier->verifyFloat(m_testCtx, GL_LINE_WIDTH, reference);
			expectError(GL_NO_ERROR);
		}
	}